

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void free_temp_pseudo(Proc *proc,Pseudo *pseudo,_Bool free_local)

{
  anon_union_64_3_727c6158_for_LuaSymbol_1 *paVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  Proc *proc_00;
  
LAB_00117150:
  uVar2 = *(uint *)pseudo;
  if ((uVar2 >> 0x14 & 1) == 0) {
    uVar4 = uVar2 & 0xf;
    if (0xd < uVar4 - 1) {
      return;
    }
    switch(uVar4) {
    case 1:
      proc_00 = (Proc *)&proc->temp_flt_pseudos;
      break;
    case 2:
    case 3:
      proc_00 = (Proc *)&proc->temp_int_pseudos;
      break;
    case 4:
    case 0xb:
      proc_00 = (Proc *)&proc->temp_pseudos;
      if (uVar4 == 0xb) {
        if ((pseudo->field_3).range_in_use != 0) {
          __assert_fail("pseudo->range_in_use == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x269,"void free_temp_pseudo(Proc *, Pseudo *, _Bool)");
        }
        goto LAB_001171d9;
      }
      break;
    default:
      goto switchD_00117175_caseD_5;
    case 0xc:
      bVar3 = (byte)(uVar2 >> 4) & 0x1f;
      paVar1 = &((pseudo->field_3).symbol)->field_1;
      (paVar1->variable).value_type.type_code =
           (paVar1->variable).value_type.type_code & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
      return;
    case 0xe:
      goto switchD_00117175_caseD_e;
    }
    if (((free_local & 1U) != 0) || ((pseudo->field_3).symbol == (LuaSymbol *)0x0)) {
LAB_001171d9:
      free_register(proc_00,(PseudoGenerator *)(ulong)(uVar2 >> 4 & 0xffff),
                    (&switchD_00117175::switchdataD_00132428)[uVar4 - 1] + 0x132428);
      return;
    }
  }
switchD_00117175_caseD_5:
  return;
switchD_00117175_caseD_e:
  free_local = false;
  free_temp_pseudo(proc,(pseudo->field_3).index_info.key,false);
  pseudo = (pseudo->field_3).index_info.container;
  goto LAB_00117150;
}

Assistant:

static void free_temp_pseudo(Proc *proc, Pseudo *pseudo, bool free_local)
{
	if (pseudo->freed)
		return;
	PseudoGenerator *gen;
	switch (pseudo->type) {
	case PSEUDO_TEMP_FLT:
		gen = &proc->temp_flt_pseudos;
		break;
	case PSEUDO_TEMP_INT:
	case PSEUDO_TEMP_BOOL:
		gen = &proc->temp_int_pseudos;
		break;
	case PSEUDO_RANGE:
	case PSEUDO_TEMP_ANY:
		gen = &proc->temp_pseudos;
		if (pseudo->type == PSEUDO_RANGE) {
			// all PSEUDO_RANGE_SELECT should have been freed if the range is being freed
			assert(pseudo->range_in_use == 0);
		}
		break;
	case PSEUDO_INDEXED:
		free_temp_pseudo(proc, pseudo->index_info.key, false);
		free_temp_pseudo(proc, pseudo->index_info.container, false);
		return;
	case PSEUDO_RANGE_SELECT: {
		unsigned regbit = (1u << pseudo->regnum);
		// mark the register as no longer used; its only 1 bit not a proper ref count
		pseudo->range_pseudo->range_in_use &= ~regbit;
		return;
	}
	default:
		// Not a temp, so no need to do anything
		return;
	}
	if (!free_local && pseudo->type != PSEUDO_RANGE && pseudo->temp_for_local) {
		return;
	}
//	if (gen == &proc->temp_int_pseudos) {
//		fprintf(stderr, "Freeing reg %u\n", pseudo->regnum);
//	}
	free_register(proc, gen, pseudo->regnum);
}